

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_CheckSplash(AActor *self,double distance)

{
  sector_t *psVar1;
  double dVar2;
  undefined1 local_38 [8];
  DVector3 pos;
  sector_t *floorsec;
  double distance_local;
  AActor *self_local;
  
  sector_t::LowestFloorAt(self->Sector,self,(sector_t **)&pos.Z);
  dVar2 = AActor::Z(self);
  if ((dVar2 <= self->floorz + distance) && (self->floorsector == (sector_t *)pos.Z)) {
    psVar1 = sector_t::GetHeightSec(self->Sector);
    if ((psVar1 == (sector_t *)0x0) && (*(long *)((long)pos.Z + 0x1a0) == 0)) {
      AActor::PosRelative((DVector3 *)local_38,self,(sector_t *)pos.Z);
      pos.Y = self->floorz;
      P_HitWater(self,(sector_t *)pos.Z,(DVector3 *)local_38,false,false,false);
    }
  }
  return;
}

Assistant:

void P_CheckSplash(AActor *self, double distance)
{
	sector_t *floorsec;
	self->Sector->LowestFloorAt(self, &floorsec);
	if (self->Z() <= self->floorz + distance && self->floorsector == floorsec && self->Sector->GetHeightSec() == NULL && floorsec->heightsec == NULL)
	{
		// Explosion splashes never alert monsters. This is because A_Explode has
		// a separate parameter for that so this would get in the way of proper 
		// behavior.
		DVector3 pos = self->PosRelative(floorsec);
		pos.Z = self->floorz;
		P_HitWater (self, floorsec, pos, false, false);
	}
}